

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  string *this_00;
  pointer pcVar1;
  size_t sVar2;
  uint uVar3;
  IResultCapture *pIVar4;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (this->m_info).macroName.m_start = (builder->m_info).macroName.m_start;
  (this->m_info).macroName.m_size = (builder->m_info).macroName.m_size;
  (this->m_info).macroName.m_data = (char *)0x0;
  this_00 = &(this->m_info).message;
  (this->m_info).message._M_dataplus._M_p = (pointer)&(this->m_info).message.field_2;
  pcVar1 = (builder->m_info).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00,pcVar1,pcVar1 + (builder->m_info).message._M_string_length);
  uVar3 = (builder->m_info).sequence;
  (this->m_info).type = (builder->m_info).type;
  (this->m_info).sequence = uVar3;
  sVar2 = (builder->m_info).lineInfo.line;
  (this->m_info).lineInfo.file = (builder->m_info).lineInfo.file;
  (this->m_info).lineInfo.line = sVar2;
  this->m_moved = false;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this_00,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[8])(pIVar4,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info ), m_moved()
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }